

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::dht_put_alert::dht_put_alert
          (dht_put_alert *this,stack_allocator *param_1,array<char,_32UL> *key,
          array<char,_64UL> *sig,string *s,int64_t sequence_number,int n)

{
  int64_t sequence_number_local;
  string *s_local;
  array<char,_64UL> *sig_local;
  array<char,_32UL> *key_local;
  stack_allocator *param_1_local;
  dht_put_alert *this_local;
  
  libtorrent::alert::alert(&this->super_alert);
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__dht_put_alert_00b89ba8;
  digest32<160L>::digest32(&this->target,(char *)0x0);
  *(undefined8 *)(this->public_key)._M_elems = *(undefined8 *)key->_M_elems;
  *(undefined8 *)((this->public_key)._M_elems + 8) = *(undefined8 *)(key->_M_elems + 8);
  *(undefined8 *)((this->public_key)._M_elems + 0x10) = *(undefined8 *)(key->_M_elems + 0x10);
  *(undefined8 *)((this->public_key)._M_elems + 0x18) = *(undefined8 *)(key->_M_elems + 0x18);
  memcpy(&this->signature,sig,0x40);
  ::std::__cxx11::string::string((string *)&this->salt,(string *)s);
  this->seq = sequence_number;
  this->num_success = n;
  return;
}

Assistant:

dht_put_alert::dht_put_alert(aux::stack_allocator&
		, std::array<char, 32> const& key
		, std::array<char, 64> const& sig
		, std::string s
		, std::int64_t sequence_number
		, int n)
		: target(nullptr)
		, public_key(key)
		, signature(sig)
		, salt(std::move(s))
		, seq(sequence_number)
		, num_success(n)
	{}